

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction_Mocap::Compute_array_dt
          (ChFunction_Mocap *this,ChArray<> *array_A,ChArray<> *array_A_dt)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  uVar6 = (ulong)this->samples;
  if (0 < (long)uVar6) {
    pdVar2 = (array_A_dt->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar3 = (array_A_dt->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows;
    pdVar4 = (array_A->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar5 = (array_A->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows;
    uVar9 = 0;
    do {
      uVar1 = uVar9 + 1;
      uVar7 = (uint)uVar9;
      if (uVar1 < uVar6) {
        uVar7 = (uint)uVar1;
      }
      if ((long)uVar5 <= (long)(ulong)uVar7) {
LAB_0088d48c:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Array<double, -1, 1>, Level = 0]"
                     );
      }
      iVar8 = (uint)uVar9 - 1;
      if (uVar9 < 2) {
        iVar8 = 0;
      }
      if ((iVar8 < 0) || (uVar5 <= (ulong)(long)iVar8)) goto LAB_0088d48c;
      if ((~((long)uVar3 >> 0x3f) & uVar3) == uVar9) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar2[uVar9] = (pdVar4[uVar7] - pdVar4[iVar8]) / (1.0 / this->samp_freq);
      uVar9 = uVar1;
    } while (uVar6 != uVar1);
  }
  return;
}

Assistant:

void ChFunction_Mocap::Compute_array_dt(const ChArray<>& array_A, ChArray<>& array_A_dt) const {
    int i, ia, ib;
    double y_dt;

    for (i = 0; i < samples; i++) {
        ia = i - 1;  // boundaries cases
        if (ia <= 0) {
            ia = 0;
        }
        ib = i + 1;
        if (ib >= samples) {
            ib = i;
        }
        // trapezoidal differentiation
        y_dt = ((array_A(ib)) - (array_A(ia))) / Get_timeslice();

        array_A_dt(i) = y_dt;
    }
}